

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O0

int32_t ulocimp_getScript_63(char *localeID,char *script,int32_t scriptCapacity,char **pEnd)

{
  UBool UVar1;
  char cVar2;
  bool bVar3;
  int local_30;
  int local_2c;
  int32_t i;
  int32_t idLen;
  char **pEnd_local;
  int32_t scriptCapacity_local;
  char *script_local;
  char *localeID_local;
  
  local_2c = 0;
  if (pEnd != (char **)0x0) {
    *pEnd = localeID;
  }
  while( true ) {
    bVar3 = false;
    if ((((localeID[local_2c] != '\0') && (bVar3 = false, localeID[local_2c] != '.')) &&
        (bVar3 = false, localeID[local_2c] != '@')) &&
       ((bVar3 = false, localeID[local_2c] != '_' && (bVar3 = false, localeID[local_2c] != '-')))) {
      UVar1 = uprv_isASCIILetter_63(localeID[local_2c]);
      bVar3 = UVar1 != '\0';
    }
    if (!bVar3) break;
    local_2c = local_2c + 1;
  }
  if (local_2c == 4) {
    if (pEnd != (char **)0x0) {
      *pEnd = localeID + 4;
    }
    if (scriptCapacity < 4) {
      local_2c = scriptCapacity;
    }
    script_local = localeID;
    if (0 < local_2c) {
      script_local = localeID + 1;
      cVar2 = uprv_toupper_63(*localeID);
      *script = cVar2;
    }
    for (local_30 = 1; local_30 < local_2c; local_30 = local_30 + 1) {
      cVar2 = uprv_asciitolower_63(*script_local);
      script[local_30] = cVar2;
      script_local = script_local + 1;
    }
  }
  else {
    local_2c = 0;
  }
  return local_2c;
}

Assistant:

U_CFUNC int32_t
ulocimp_getScript(const char *localeID,
                  char *script, int32_t scriptCapacity,
                  const char **pEnd)
{
    int32_t idLen = 0;

    if (pEnd != NULL) {
        *pEnd = localeID;
    }

    /* copy the second item as far as possible and count its length */
    while(!_isTerminator(localeID[idLen]) && !_isIDSeparator(localeID[idLen])
            && uprv_isASCIILetter(localeID[idLen])) {
        idLen++;
    }

    /* If it's exactly 4 characters long, then it's a script and not a country. */
    if (idLen == 4) {
        int32_t i;
        if (pEnd != NULL) {
            *pEnd = localeID+idLen;
        }
        if(idLen > scriptCapacity) {
            idLen = scriptCapacity;
        }
        if (idLen >= 1) {
            script[0]=(char)uprv_toupper(*(localeID++));
        }
        for (i = 1; i < idLen; i++) {
            script[i]=(char)uprv_tolower(*(localeID++));
        }
    }
    else {
        idLen = 0;
    }
    return idLen;
}